

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harmonic.cpp
# Opt level: O2

void __thiscall Harmonic::star_map(Harmonic *this)

{
  Point *this_00;
  Vertex *pVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  CVertexTrait *pCVar5;
  double dVar6;
  SolidVertexIterator viter;
  double local_170;
  double local_168;
  double dStack_160;
  undefined1 local_158 [16];
  double local_148;
  SolidVertexIterator local_140;
  
  MeshLib::SolidVertexIterator::SolidVertexIterator(&local_140,this->_nmesh);
  local_168 = 0.0;
  dStack_160 = 0.0;
  local_170 = 0.0;
  while (local_140.m_iter.m_finished != true) {
    pVVar1 = (local_140.m_iter.m_pointer)->data;
    local_168 = local_168 + (pVVar1->m_point).v[0];
    dStack_160 = dStack_160 + (pVVar1->m_point).v[1];
    local_158._8_8_ = dStack_160;
    local_158._0_8_ = local_168;
    local_170 = local_170 + (pVVar1->m_point).v[2];
    local_148 = local_170;
    AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_140.m_iter);
  }
  iVar4 = MeshLib::Solid::numVertices(this->_nmesh);
  dVar6 = (double)iVar4;
  local_148 = local_170 / dVar6;
  auVar3._8_8_ = dStack_160;
  auVar3._0_8_ = local_168;
  auVar2._8_8_ = dVar6;
  auVar2._0_8_ = dVar6;
  local_158 = divpd(auVar3,auVar2);
  MeshLib::SolidVertexIterator::SolidVertexIterator(&local_140,this->_nmesh);
  while (local_140.m_iter.m_finished != true) {
    pVVar1 = (local_140.m_iter.m_pointer)->data;
    this_00 = &pVVar1->m_point;
    MeshLib::Point::operator-=(this_00,(Point *)local_158);
    dVar6 = MeshLib::Point::norm(this_00);
    MeshLib::Point::operator/=(this_00,dVar6);
    pCVar5 = MeshLib::trait<MeshLib::CVertexTrait,MeshLib::Vertex>(pVVar1);
    dVar6 = (pVVar1->m_point).v[1];
    (pCVar5->c_normal).v[0] = (pVVar1->m_point).v[0];
    (pCVar5->c_normal).v[1] = dVar6;
    (pCVar5->c_normal).v[2] = (pVVar1->m_point).v[2];
    AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_140.m_iter);
  }
  return;
}

Assistant:

void Harmonic::star_map() {
	Point center(0, 0, 0);
	for (SolidVertexIterator viter(_nmesh); !viter.end(); ++viter) {
		Solid::tVertex vertex = *viter;
		center += vertex->point();
	}
	center /= _nmesh->numVertices();
	for (SolidVertexIterator viter(_nmesh); !viter.end(); ++viter) {
		Solid::tVertex vertex = *viter;
		vertex->point() -= center;
		vertex->point() /= vertex->point().norm();
		v_n(vertex) = vertex->point();
	}
}